

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O2

void __thiscall
spvtools::opt::BasicBlock::ForEachSuccessorLabel(BasicBlock *this,function<void_(unsigned_int)> *f)

{
  function<void_(unsigned_int)> *this_00;
  _Any_data local_60;
  _Manager_type local_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  std::function<void_(unsigned_int)>::function((function<void_(unsigned_int)> *)&local_60,f);
  local_40._8_8_ = 0;
  this_00 = (function<void_(unsigned_int)> *)operator_new(0x20);
  std::function<void_(unsigned_int)>::function(this_00,(function<void_(unsigned_int)> *)&local_60);
  local_28 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.cpp:107:27)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.cpp:107:27)>
             ::_M_manager;
  local_40._M_unused._M_object = this_00;
  WhileEachSuccessorLabel(this,(function<bool_(unsigned_int)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  return;
}

Assistant:

void BasicBlock::ForEachSuccessorLabel(
    const std::function<void(const uint32_t)>& f) const {
  WhileEachSuccessorLabel([f](const uint32_t l) {
    f(l);
    return true;
  });
}